

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O1

int Mop_ManReadParams(char *pBuffer,int *pnIns,int *pnOuts)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  
  pcVar2 = strstr(pBuffer,".i ");
  pcVar3 = strstr(pBuffer,".o ");
  iVar1 = -1;
  if (pcVar3 != (char *)0x0 && pcVar2 != (char *)0x0) {
    iVar1 = atoi(pcVar2 + 2);
    *pnIns = iVar1;
    iVar1 = atoi(pcVar3 + 2);
    *pnOuts = iVar1;
    cVar4 = *pBuffer;
    if (cVar4 == '\0') {
      iVar1 = 0;
    }
    else {
      pcVar2 = pBuffer + 1;
      iVar1 = 0;
      do {
        iVar1 = iVar1 + (uint)(cVar4 == '\n');
        cVar4 = *pcVar2;
        pcVar2 = pcVar2 + 1;
      } while (cVar4 != '\0');
    }
  }
  return iVar1;
}

Assistant:

int Mop_ManReadParams( char * pBuffer, int * pnIns, int * pnOuts )
{
    char * pIns  = strstr( pBuffer, ".i " );
    char * pOuts = strstr( pBuffer, ".o " );
    char * pStr  = pBuffer; int nCubes = 0;
    if ( pIns == NULL || pOuts == NULL )
        return -1;
    *pnIns  = atoi( pIns + 2 );
    *pnOuts = atoi( pOuts + 2 );
    while ( *pStr )
        nCubes += (*pStr++ == '\n');
    return nCubes;
}